

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnSimdLaneOp(TypeChecker *this,Opcode opcode,uint64_t lane_idx)

{
  uint uVar1;
  uint32_t uVar2;
  Result RVar3;
  ulong uVar4;
  Opcode local_1c;
  
  local_1c.enum_ = opcode.enum_;
  uVar2 = Opcode::GetSimdLaneCount(&local_1c);
  uVar4 = (ulong)uVar2;
  if (uVar4 <= lane_idx) {
    PrintError(this,"lane index must be less than %d (got %lu)",uVar4,lane_idx);
  }
  uVar1 = local_1c.enum_ - I8X16ExtractLaneS;
  if (uVar1 < 0x13) {
    if ((0x24933U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x49244U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0017764e;
      RVar3 = CheckOpcode2(this,local_1c);
    }
    else {
      RVar3 = CheckOpcode1(this,local_1c);
    }
    RVar3.enum_._0_1_ = RVar3.enum_ == Error || uVar4 <= lane_idx;
    RVar3.enum_._1_3_ = 0;
    return (Result)RVar3.enum_;
  }
LAB_0017764e:
  abort();
}

Assistant:

Result TypeChecker::OnSimdLaneOp(Opcode opcode, uint64_t lane_idx) {
  Result result = Result::Ok;
  uint32_t lane_count = opcode.GetSimdLaneCount();
  if (lane_idx >= lane_count) {
    PrintError("lane index must be less than %d (got %" PRIu64 ")", lane_count,
               lane_idx);
    result = Result::Error;
  }

  switch (opcode) {
    case Opcode::I8X16ExtractLaneS:
    case Opcode::I8X16ExtractLaneU:
    case Opcode::I16X8ExtractLaneS:
    case Opcode::I16X8ExtractLaneU:
    case Opcode::I32X4ExtractLane:
    case Opcode::F32X4ExtractLane:
    case Opcode::I64X2ExtractLane:
    case Opcode::F64X2ExtractLane:
      result |= CheckOpcode1(opcode);
      break;
    case Opcode::I8X16ReplaceLane:
    case Opcode::I16X8ReplaceLane:
    case Opcode::I32X4ReplaceLane:
    case Opcode::F32X4ReplaceLane:
    case Opcode::I64X2ReplaceLane:
    case Opcode::F64X2ReplaceLane:
      result |= CheckOpcode2(opcode);
      break;
    default:
      WABT_UNREACHABLE;
  }
  return result;
}